

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

unsigned_long ot::commissioner::utils::Decode<unsigned_long>(uint8_t *aBuf,size_t aLength)

{
  ulong local_30;
  size_t i;
  ulong uStack_20;
  bool condition;
  unsigned_long ret;
  size_t aLength_local;
  uint8_t *aBuf_local;
  
  uStack_20 = 0;
  if (7 < aLength) {
    for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
      uStack_20 = uStack_20 << 8 | (ulong)aBuf[local_30];
    }
    return uStack_20;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/utils.hpp"
                ,0xa2,
                "T ot::commissioner::utils::Decode(const uint8_t *, size_t) [T = unsigned long]");
}

Assistant:

T Decode(const uint8_t *aBuf, size_t aLength)
{
    T ret = 0;

    ASSERT(aLength >= sizeof(T));

    for (size_t i = 0; i < sizeof(T); ++i)
    {
        ret = (ret << 8) | aBuf[i];
    }
    return ret;
}